

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall
mp::SolverOptionManager::AddOptionSynonyms_Inline_Back
          (SolverOptionManager *this,char *names_list,char *realName)

{
  SolverOption *this_00;
  logic_error *this_01;
  char **in_R8;
  char *local_48;
  char *local_40;
  string local_38;
  
  local_48 = realName;
  local_40 = names_list;
  this_00 = FindOption(this,realName,false);
  if (this_00 != (SolverOption *)0x0) {
    SolverOption::add_synonyms_back(this_00,names_list);
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  fmt::format<char_const*,char_const*>
            (&local_38,(fmt *)"Option {} referred to by synonyms {} is unknown",
             (CStringRef)&local_48,&local_40,in_R8);
  std::logic_error::logic_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void SolverOptionManager::AddOptionSynonyms_Inline_Back(
    const char* names_list, const char* realName)
{
  SolverOption* real = FindOption(realName);
  if (!real)
    throw std::logic_error(
        fmt::format("Option {} referred to by synonyms {} is unknown",
                    realName, names_list));
  real->add_synonyms_back(names_list);
}